

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void amrex::Add<amrex::TagBox,void>
               (FabArray<amrex::TagBox> *dst,FabArray<amrex::TagBox> *src,int srccomp,int dstcomp,
               int numcomp,IntVect *nghost)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  long lVar3;
  int in_EDX;
  FabArray<amrex::TagBox> *in_RDI;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<char> dstFab;
  Array4<const_char> srcFab;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  int iVar4;
  int local_248;
  int local_244;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 do_tiling_;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  MFIter *in_stack_fffffffffffffde0;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  Box local_17c;
  Box *local_160;
  MFIter local_158;
  int local_ec;
  int local_e8;
  int local_e4;
  MFIter *local_d0;
  int local_c8;
  Box *local_c0;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  Box *local_a8;
  undefined4 local_9c;
  Box *local_98;
  undefined4 local_8c;
  Box *local_88;
  undefined8 local_80;
  int local_78;
  Box *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffdc0 >> 0x38);
  local_ec = in_R8D;
  local_e8 = in_ECX;
  local_e4 = in_EDX;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (bool)do_tiling_);
  while (bVar2 = MFIter::isValid(&local_158), bVar2) {
    MFIter::growntilebox
              (in_stack_fffffffffffffde0,
               (IntVect *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_160 = &local_17c;
    bVar2 = Box::ok(local_160);
    if (bVar2) {
      in_stack_fffffffffffffda0 = &local_158;
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(in_RDI,in_stack_fffffffffffffda0);
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>
                ((FabArray<amrex::TagBox> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),(MFIter *)in_RDI);
      local_c0 = local_160;
      local_88 = local_160;
      local_8c = 0;
      local_b8 = (local_160->smallend).vect[0];
      local_98 = local_160;
      local_9c = 1;
      iStack_b4 = (local_160->smallend).vect[1];
      in_stack_fffffffffffffde0 = *(MFIter **)(local_160->smallend).vect;
      local_a8 = local_160;
      local_ac = 2;
      local_c8 = (local_160->smallend).vect[2];
      local_70 = local_160;
      local_38 = &local_160->bigend;
      local_3c = 0;
      local_68 = local_38->vect[0];
      local_48 = &local_160->bigend;
      local_4c = 1;
      in_stack_fffffffffffffdd8 = (local_160->bigend).vect[1];
      local_80 = *(undefined8 *)local_38->vect;
      local_58 = &local_160->bigend;
      local_5c = 2;
      in_stack_fffffffffffffddc = (local_160->bigend).vect[2];
      for (local_244 = 0; local_248 = local_c8, local_d0 = in_stack_fffffffffffffde0,
          local_b0 = local_c8, local_78 = in_stack_fffffffffffffddc,
          iStack_64 = in_stack_fffffffffffffdd8, local_60 = in_stack_fffffffffffffddc,
          local_244 < local_ec; local_244 = local_244 + 1) {
        for (; iVar4 = iStack_b4, local_248 <= in_stack_fffffffffffffddc; local_248 = local_248 + 1)
        {
          for (; iVar1 = local_b8, iVar4 <= in_stack_fffffffffffffdd8; iVar4 = iVar4 + 1) {
            while (in_stack_fffffffffffffdb0 = iVar1, in_stack_fffffffffffffdb0 <= local_68) {
              local_2c = local_248;
              local_30 = local_244 + local_e4;
              local_20 = &local_1c0;
              local_14 = local_248;
              local_18 = local_244 + local_e8;
              local_8 = &local_200;
              lVar3 = (long)(in_stack_fffffffffffffdb0 - local_1e0) +
                      (iVar4 - local_1dc) * local_1f8 + (local_248 - local_1d8) * local_1f0 +
                      local_18 * local_1e8;
              *(char *)(local_200 + lVar3) =
                   *(char *)(local_200 + lVar3) +
                   *(char *)(local_1c0 +
                            (long)(in_stack_fffffffffffffdb0 - local_1a0) +
                            (iVar4 - local_19c) * local_1b8 + (local_248 - local_198) * local_1b0 +
                            local_30 * local_1a8);
              local_28 = iVar4;
              local_24 = in_stack_fffffffffffffdb0;
              local_10 = iVar4;
              local_c = in_stack_fffffffffffffdb0;
              iVar1 = in_stack_fffffffffffffdb0 + 1;
            }
          }
          in_stack_fffffffffffffdb4 = iVar4;
        }
      }
    }
    MFIter::operator++(&local_158);
  }
  MFIter::~MFIter(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void
Add (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) += srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) += srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}